

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::PatchSetPropertyScoped<false,Js::InlineCache>
               (FunctionBody *functionBody,InlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,FrameDisplay *pDisplay,PropertyId propertyId,
               Var newValue,Var defaultInstance,PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  BOOL BVar4;
  DescriptorFlags DVar5;
  ScriptContext *requestContext;
  void *pvVar6;
  undefined4 *puVar7;
  ThreadContext *pTVar8;
  RecyclableObject *object_00;
  PropertyRecord *this;
  char16 *pcVar9;
  GlobalObject *local_178;
  undefined1 local_170 [8];
  PropertyValueInfo info2_1;
  RecyclableObject *obj;
  RecyclableObject *obj_1;
  Var pvStack_118;
  DescriptorFlags flags;
  Var setterValue;
  GlobalObject *globalObject;
  undefined1 local_100 [4];
  PropertyOperationFlags setPropertyOpFlags;
  PropertyValueInfo info2;
  Var pvStack_b8;
  BOOL result;
  Var value;
  DisableImplicitFlags disableImplicitFlags;
  Type *pTStack_a8;
  BOOL setAccessorResult;
  Type *type;
  undefined1 local_98 [4];
  uint16 i;
  bool isLexicalThisSlotSymbol;
  bool allowUndecInConsoleScope;
  PropertyValueInfo info;
  RecyclableObject *object;
  uint16 length;
  ScriptContext *scriptContext;
  Var newValue_local;
  PropertyId propertyId_local;
  FrameDisplay *pDisplay_local;
  InlineCacheIndex inlineCacheIndex_local;
  InlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  requestContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  uVar3 = FrameDisplay::GetLength(pDisplay);
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_98);
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_98,functionBody,inlineCache,inlineCacheIndex,true);
  type._7_1_ = (propertyOperationFlags & PropertyOperation_AllowUndeclInConsoleScope) ==
               PropertyOperation_AllowUndeclInConsoleScope;
  type._6_1_ = propertyId == 0x2d5;
  type._4_2_ = 0;
  while( true ) {
    if (uVar3 <= type._4_2_) {
      if ((type._6_1_ & 1) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xcb2,"(!isLexicalThisSlotSymbol)","!isLexicalThisSlotSymbol");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      if (uVar3 != 0) {
        pvVar6 = FrameDisplay::GetItem(pDisplay,uVar3 - 1);
        bVar2 = VarIs<Js::ConsoleScopeActivationObject>(pvVar6);
        if (bVar2) {
          if (1 < uVar3) {
            pvVar6 = FrameDisplay::GetItem(pDisplay,uVar3 - 2);
            bVar2 = VarIs<Js::GlobalObject>(pvVar6);
            if (bVar2) {
              local_178 = UnsafeVarTo<Js::GlobalObject>(pvVar6);
            }
            else {
              local_178 = (GlobalObject *)0x0;
            }
            setterValue = local_178;
            if (local_178 != (GlobalObject *)0x0) {
              pvStack_118 = (Var)0x0;
              DVar5 = GetRootSetter<int>((RecyclableObject *)local_178,propertyId,
                                         &stack0xfffffffffffffee8,(PropertyValueInfo *)local_98,
                                         requestContext);
              if ((DVar5 & Accessor) == Accessor) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                            ,0xcc0,"((flags & Accessor) != Accessor)",
                                            "(flags & Accessor) != Accessor");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 0;
              }
              if ((DVar5 & Proxy) == Proxy) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                            ,0xcc1,"((flags & Proxy) != Proxy)",
                                            "(flags & Proxy) != Proxy");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 0;
              }
              if ((((DVar5 & Data) == Data) && ((DVar5 & Writable) == None)) &&
                 ((type._7_1_ & 1) == 0)) {
                if ((DVar5 & Const) != None) {
                  JavascriptError::ThrowTypeError(requestContext,-0x7ff5fbe1,(PCWSTR)0x0);
                }
                if ((type._6_1_ & 1) == 0) {
                  return;
                }
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                            ,0xcca,"(!isLexicalThisSlotSymbol)",
                                            "!isLexicalThisSlotSymbol");
                if (bVar2) {
                  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar7 = 0;
                  return;
                }
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
            }
          }
          pvVar6 = FrameDisplay::GetItem(pDisplay,uVar3 - 1);
          object_00 = VarTo<Js::RecyclableObject>(pvVar6);
          this = ScriptContext::GetPropertyName(requestContext,propertyId);
          pcVar9 = PropertyRecord::GetBuffer(this);
          Output::Trace(ConsoleScopePhase,L"Adding property \'%s\' to console scope object\n",pcVar9
                       );
          SetProperty(object_00,object_00,propertyId,newValue,requestContext,propertyOperationFlags)
          ;
          return;
        }
      }
      bVar2 = TaggedNumber::Is(defaultInstance);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xcd8,"(!TaggedNumber::Is(defaultInstance))",
                                    "Root object is an int or tagged float?");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      if (defaultInstance == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xcd9,"(defaultInstance != nullptr)",
                                    "defaultInstance != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      info2_1._56_8_ = VarTo<Js::RecyclableObject>(defaultInstance);
      PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_170);
      SetRootProperty((RecyclableObject *)info2_1._56_8_,propertyId,newValue,
                      (PropertyValueInfo *)local_170,requestContext,
                      propertyOperationFlags | PropertyOperation_Root);
      return;
    }
    pvVar6 = FrameDisplay::GetItem(pDisplay,(uint)type._4_2_);
    info._56_8_ = UnsafeVarTo<Js::RecyclableObject>(pvVar6);
    bVar2 = VarIs<Js::ConsoleScopeActivationObject,Js::RecyclableObject>
                      ((RecyclableObject *)info._56_8_);
    if ((bVar2) && ((uint)type._4_2_ != uVar3 - 1)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0xc73,
                                  "(!VarIs<ConsoleScopeActivationObject>(object) || (i == length - 1))"
                                  ,"Invalid location for ConsoleScopeActivationObject");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pTStack_a8 = RecyclableObject::GetType((RecyclableObject *)info._56_8_);
    bVar2 = CacheOperators::TrySetProperty<true,true,true,true,true,true,false,false>
                      ((RecyclableObject *)info._56_8_,false,propertyId,newValue,requestContext,
                       propertyOperationFlags,(PropertyCacheOperationInfo *)0x0,
                       (PropertyValueInfo *)local_98);
    if (bVar2) {
      return;
    }
    value._4_4_ = 0;
    bVar2 = SetAccessorOrNonWritableProperty
                      ((Var)info._56_8_,(RecyclableObject *)info._56_8_,propertyId,newValue,
                       (PropertyValueInfo *)local_98,requestContext,propertyOperationFlags,false,
                       (bool)(type._7_1_ & 1),(BOOL *)((long)&value + 4));
    if (bVar2) {
      return;
    }
    BVar4 = IsObject((RecyclableObject *)info._56_8_);
    if (BVar4 == 0) {
      JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,requestContext);
    }
    BVar4 = HasProperty((RecyclableObject *)info._56_8_,propertyId);
    if (BVar4 != 0) break;
    type._4_2_ = type._4_2_ + 1;
  }
  pTVar8 = ScriptContext::GetThreadContext(requestContext);
  value._3_1_ = ThreadContext::GetDisableImplicitFlags(pTVar8);
  pTVar8 = ScriptContext::GetThreadContext(requestContext);
  ThreadContext::SetDisableImplicitFlags(pTVar8,DisableImplicitCallAndExceptionFlag);
  info2._60_4_ = GetProperty((RecyclableObject *)info._56_8_,propertyId,&stack0xffffffffffffff48,
                             requestContext,(PropertyValueInfo *)0x0);
  pTVar8 = ScriptContext::GetThreadContext(requestContext);
  ThreadContext::SetDisableImplicitFlags(pTVar8,value._3_1_);
  if ((((info2._60_4_ != 0) &&
       (bVar2 = ScriptContext::IsUndeclBlockVar(requestContext,pvStack_b8), bVar2)) &&
      ((type._7_1_ & 1) == 0)) && ((type._6_1_ & 1) == 0)) {
    JavascriptError::ThrowReferenceError(requestContext,-0x7ff5ec07,(PCWSTR)0x0);
  }
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_100);
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_100,functionBody,inlineCache,inlineCacheIndex,true);
  globalObject._4_4_ = 0;
  if ((type._7_1_ & 1) != 0) {
    globalObject._4_4_ = 0x100;
  }
  (**(code **)(*(long *)info._56_8_ + 0xb8))
            (info._56_8_,propertyId,newValue,globalObject._4_4_,local_100);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,InlineCachePhase);
  if ((bVar2) && ((DAT_01ec73ca & 1) != 0)) {
    CacheOperators::TraceCache
              (inlineCache,L"PatchSetPropertyScoped",propertyId,requestContext,
               (RecyclableObject *)info._56_8_);
  }
  bVar2 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>((RecyclableObject *)info._56_8_);
  if (bVar2) {
    return;
  }
  if ((type._7_1_ & 1) != 0) {
    return;
  }
  CacheOperators::CachePropertyWrite
            ((RecyclableObject *)info._56_8_,false,pTStack_a8,propertyId,
             (PropertyValueInfo *)local_100,requestContext);
  return;
}

Assistant:

inline void JavascriptOperators::PatchSetPropertyScoped(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, FrameDisplay *pDisplay, PropertyId propertyId, Var newValue, Var defaultInstance, PropertyOperationFlags propertyOperationFlags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchSetPropertyScoped);
        // Set the property using a scope stack rather than an individual instance.
        // Walk the stack until we find an instance that has the property and store
        // the new value there.

        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        uint16 length = pDisplay->GetLength();
        RecyclableObject *object;

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);

        bool allowUndecInConsoleScope = (propertyOperationFlags & PropertyOperation_AllowUndeclInConsoleScope) == PropertyOperation_AllowUndeclInConsoleScope;
        bool isLexicalThisSlotSymbol = (propertyId == PropertyIds::_this);

        for (uint16 i = 0; i < length; i++)
        {
            object = UnsafeVarTo<RecyclableObject>(pDisplay->GetItem(i));

            AssertMsg(!VarIs<ConsoleScopeActivationObject>(object) || (i == length - 1), "Invalid location for ConsoleScopeActivationObject");

            Type* type = object->GetType();
            if (CacheOperators::TrySetProperty<true, true, true, true, true, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false>(
                    object, false, propertyId, newValue, scriptContext, propertyOperationFlags, nullptr, &info))
            {
                return;
            }

            // In scoped set property, we need to set the property when it is available; it could be a setter
            // or normal property. we need to check setter first, and if no setter is available, but HasProperty
            // is true, this must be a normal property.
            // TODO: merge OP_HasProperty and GetSetter in one pass if there is perf problem. In fastDOM we have quite
            // a lot of setters so separating the two might be actually faster.
            BOOL setAccessorResult = FALSE;
            if (SetAccessorOrNonWritableProperty(object, object, propertyId, newValue, &info, scriptContext, propertyOperationFlags, false, allowUndecInConsoleScope, &setAccessorResult))
            {
                return;
            }
            else if (!JavascriptOperators::IsObject(object))
            {
                JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, scriptContext);
            }

            // Need to do a "get" of the current value (if any) to make sure that we're not writing to
            // let/const before declaration, but we need to disable implicit calls around the "get",
            // so we need to do a "has" first to make sure the "get" is valid (e.g., "get" on a HostDispatch
            // with implicit calls disabled will always "succeed").
            if (JavascriptOperators::HasProperty(object, propertyId))
            {
                DisableImplicitFlags disableImplicitFlags = scriptContext->GetThreadContext()->GetDisableImplicitFlags();
                scriptContext->GetThreadContext()->SetDisableImplicitFlags(DisableImplicitCallAndExceptionFlag);

                Var value;
                BOOL result = JavascriptOperators::GetProperty(object, propertyId, &value, scriptContext, nullptr);

                scriptContext->GetThreadContext()->SetDisableImplicitFlags(disableImplicitFlags);

                if (result && scriptContext->IsUndeclBlockVar(value) && !allowUndecInConsoleScope && !isLexicalThisSlotSymbol)
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }

                PropertyValueInfo info2;
                PropertyValueInfo::SetCacheInfo(&info2, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
                PropertyOperationFlags setPropertyOpFlags = allowUndecInConsoleScope ? PropertyOperation_AllowUndeclInConsoleScope : PropertyOperation_None;
                object->SetProperty(propertyId, newValue, setPropertyOpFlags, &info2);

#if DBG_DUMP
                if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
                {
                    CacheOperators::TraceCache(inlineCache, _u("PatchSetPropertyScoped"), propertyId, scriptContext, object);
                }
#endif
                if (!VarIs<JavascriptProxy>(object) && !allowUndecInConsoleScope)
                {
                    CacheOperators::CachePropertyWrite(object, false, type, propertyId, &info2, scriptContext);
                }

                return;
            }
        }

        Assert(!isLexicalThisSlotSymbol);

        // If we have console scope and no one in the scope had the property add it to console scope
        if ((length > 0) && VarIs<ConsoleScopeActivationObject>(pDisplay->GetItem(length - 1)))
        {
            // CheckPrototypesForAccessorOrNonWritableProperty does not check for const in global object. We should check it here.
            if (length > 1)
            {
                Js::GlobalObject * globalObject = JavascriptOperators::TryFromVar<Js::GlobalObject>(pDisplay->GetItem(length - 2));
                if (globalObject)
                {
                    Var setterValue = nullptr;

                    DescriptorFlags flags = JavascriptOperators::GetRootSetter(globalObject, propertyId, &setterValue, &info, scriptContext);
                    Assert((flags & Accessor) != Accessor);
                    Assert((flags & Proxy) != Proxy);
                    if ((flags & Data) == Data && (flags & Writable) == None)
                    {
                        if (!allowUndecInConsoleScope)
                        {
                            if (flags & Const)
                            {
                                JavascriptError::ThrowTypeError(scriptContext, ERRAssignmentToConst);
                            }
                            Assert(!isLexicalThisSlotSymbol);
                            return;
                        }
                    }
                }
            }

            RecyclableObject* obj = VarTo<RecyclableObject>(pDisplay->GetItem(length - 1));
            OUTPUT_TRACE(Js::ConsoleScopePhase, _u("Adding property '%s' to console scope object\n"), scriptContext->GetPropertyName(propertyId)->GetBuffer());
            JavascriptOperators::SetProperty(obj, obj, propertyId, newValue, scriptContext, propertyOperationFlags);
            return;
        }

        // No one in the scope stack has the property, so add it to the default instance provided by the caller.
        AssertMsg(!TaggedNumber::Is(defaultInstance), "Root object is an int or tagged float?");
        Assert(defaultInstance != nullptr);
        RecyclableObject* obj = VarTo<RecyclableObject>(defaultInstance);
        {
            //SetPropertyScoped does not use inline cache for default instance
            PropertyValueInfo info2;
            JavascriptOperators::SetRootProperty(obj, propertyId, newValue, &info2, scriptContext, (PropertyOperationFlags)(propertyOperationFlags | PropertyOperation_Root));
        }
        JIT_HELPER_END(Op_PatchSetPropertyScoped);
    }